

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O0

void __thiscall Test_aialgorithm_fillZero_Test::TestBody(Test_aialgorithm_fillZero_Test *this)

{
  char (*dest) [1];
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2a0;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_1;
  size_t i;
  size_t size2;
  int buf [132];
  AssertHelper local_50;
  Message local_48 [3];
  char local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  char buf1 [1];
  Test_aialgorithm_fillZero_Test *this_local;
  
  gtest_ar.message_.ptr_._7_1_ = 0x41;
  dest = (char (*) [1])((long)&gtest_ar.message_.ptr_ + 7);
  ai::fillZero<1ul>(dest);
  local_29 = '\0';
  testing::internal::EqHelper<false>::Compare<char,char>
            ((EqHelper<false> *)local_28,"buf1[0]","\'\\0\'",(char *)dest,&local_29);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  buf[0x83] = (int)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (buf[0x83] == 0) {
    memset(&size2,0x41,0x210);
    ai::fillZero<int,132ul>((int (*) [132])&size2);
    for (gtest_ar_1.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_1.message_.ptr_ <
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x84;
        gtest_ar_1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_1.message_.ptr_)->field_0x1) {
      local_28c = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_288,"buf[i]","0",
                 buf + (long)&gtest_ar_1.message_.ptr_[-1].field_2._M_allocated_capacity + 0xe,
                 &local_28c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
      if (!bVar1) {
        testing::Message::Message(&local_298);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                   ,0x58,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        testing::Message::~Message(&local_298);
      }
      buf[0x83] = (int)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
      if (buf[0x83] != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aialgorithm, fillZero)
{
    // one
    {
        char buf1[1];
        std::memset(&buf1, 65, sizeof buf1);
        ai::fillZero(buf1);
        ASSERT_EQ(buf1[0], '\0');
    }

    // many
    {
        int        buf[132];
        const auto size2 = ai::countOf(buf);
        std::memset(&buf, 65, size2 * sizeof(int));
        ai::fillZero(buf);
        for (size_t i = 0; i < size2; i++)
        {
            ASSERT_EQ(buf[i], 0);
        }
    }
}